

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traceback.c
# Opt level: O3

parasail_traceback_t *
parasail_result_get_traceback_extra
          (parasail_result_t *result,char *seqA,int lena,char *seqB,int lenb,
          parasail_matrix_t *matrix,char match,char pos,char neg,int case_sensitive,
          char *alphabet_aliases)

{
  byte bVar1;
  ushort uVar2;
  int *piVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  __int32_t **pp_Var11;
  parasail_traceback_t *ppVar12;
  char *pcVar13;
  int *piVar14;
  long lVar15;
  undefined4 extraout_EDX;
  uint uVar16;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  long lVar17;
  size_t sVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  char *pcVar23;
  ulong uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  byte abStack_138 [264];
  
  iVar6 = parasail_result_is_trace(result);
  if (iVar6 == 0) {
    parasail_result_get_traceback_extra_cold_26();
    return (parasail_traceback_t *)0x0;
  }
  uVar20 = result->flag;
  if ((uVar20 & 0xc00) == 0) {
    sVar18 = (size_t)(lena + lenb + 1);
    local_198 = (char *)malloc(sVar18);
    local_1a0 = (char *)malloc(sVar18);
    local_1a8 = (char *)malloc(sVar18);
    iVar6 = result->end_query;
    lVar22 = (long)iVar6;
    iVar7 = result->end_ref;
    uVar24 = (ulong)iVar7;
    piVar3 = ((result->field_4).rowcols)->score_row;
    if (alphabet_aliases == (char *)0x0) {
      sVar18 = 0;
    }
    else {
      sVar18 = strlen(alphabet_aliases);
      if ((sVar18 & 0xffffffffffffff01) != 0) {
        parasail_result_get_traceback_extra_cold_21();
        return (parasail_traceback_t *)0x0;
      }
      if (sVar18 == 0) {
        sVar18 = 0;
      }
      else {
        sVar19 = 0;
        do {
          if (case_sensitive == 0) {
            pp_Var11 = __ctype_toupper_loc();
            bVar4 = *(byte *)(*pp_Var11 + alphabet_aliases[sVar19]);
          }
          else {
            bVar4 = alphabet_aliases[sVar19];
          }
          abStack_138[sVar19] = bVar4;
          sVar19 = sVar19 + 1;
        } while (sVar18 != sVar19);
      }
    }
    pcVar13 = local_198;
    pcVar10 = local_1a8;
    pcVar23 = local_1a0;
    if ((uVar20 & 2) != 0) {
      if (iVar6 + 1 == lena) {
        if (iVar7 < lenb + -1) {
          sVar19 = (ulong)((lenb - iVar7) - 2) + 1;
          memset(local_198,0x2d,sVar19);
          memset(local_1a8,0x20,sVar19);
          lVar17 = (long)(lenb + -1);
          lVar9 = lVar17 - uVar24;
          do {
            *pcVar23 = seqB[lVar17];
            pcVar23 = pcVar23 + 1;
            lVar17 = lVar17 + -1;
          } while ((long)uVar24 < lVar17);
          pcVar13 = local_198 + lVar9;
          pcVar10 = local_1a8 + lVar9;
        }
      }
      else {
        if (iVar7 + 1 != lenb) {
          parasail_result_get_traceback_extra_cold_22();
          return (parasail_traceback_t *)0x0;
        }
        if (iVar6 < lena + -1) {
          lVar9 = (long)(lena + -1);
          do {
            if (seqA == (char *)0x0) {
              cVar5 = '*';
            }
            else {
              cVar5 = seqA[lVar9];
            }
            *pcVar13 = cVar5;
            pcVar13 = pcVar13 + 1;
            *pcVar23 = '-';
            pcVar23 = pcVar23 + 1;
            *pcVar10 = ' ';
            pcVar10 = pcVar10 + 1;
            lVar9 = lVar9 + -1;
          } while (lVar22 < lVar9);
        }
      }
    }
    bVar25 = -1 < iVar7;
    if (-1 < iVar6 || bVar25) {
      if (-1 < iVar6) {
        lVar9 = lVar22 * lenb + uVar24;
        iVar6 = 4;
        do {
          if ((long)uVar24 < 0) {
            if ((result->flag & 4) == 0) {
              lVar9 = lVar22 + 1;
              lVar22 = lVar22 << 0x20;
              do {
                if (seqA == (char *)0x0) {
                  cVar5 = '*';
                }
                else {
                  cVar5 = seqA[lVar22 >> 0x20];
                }
                *pcVar13 = cVar5;
                pcVar13 = pcVar13 + 1;
                *pcVar23 = '-';
                pcVar23 = pcVar23 + 1;
                *pcVar10 = ' ';
                pcVar10 = pcVar10 + 1;
                lVar9 = lVar9 + -1;
                lVar22 = lVar22 + -0x100000000;
              } while (0 < lVar9);
            }
            goto LAB_00548ebb;
          }
          if (iVar6 == 1) {
            *pcVar13 = '-';
            *pcVar23 = seqB[uVar24];
            *pcVar10 = ' ';
            iVar6 = 4;
            if (((*(byte *)((long)piVar3 + lVar9) & 8) == 0) &&
               (iVar6 = 1, (*(byte *)((long)piVar3 + lVar9) & 0x10) == 0)) {
              parasail_result_get_traceback_extra_cold_24();
              return (parasail_traceback_t *)0x0;
            }
LAB_00548773:
            pcVar13 = pcVar13 + 1;
            bVar25 = uVar24 != 0;
            uVar24 = uVar24 - 1;
            pcVar10 = pcVar10 + 1;
            pcVar23 = pcVar23 + 1;
            if ((lVar22 < 0) && (!bVar25)) goto LAB_00548ebb;
          }
          else {
            iVar7 = (int)lVar22;
            if (iVar6 == 2) {
              if (seqA == (char *)0x0) {
                cVar5 = '*';
              }
              else {
                cVar5 = seqA[iVar7];
              }
              *pcVar13 = cVar5;
              pcVar13 = pcVar13 + 1;
              *pcVar23 = '-';
              pcVar23 = pcVar23 + 1;
              *pcVar10 = ' ';
              pcVar10 = pcVar10 + 1;
              lVar22 = lVar22 + -1;
              iVar6 = 4;
              bVar25 = true;
              if (((*(byte *)((long)piVar3 + lVar9) & 0x20) == 0) &&
                 (iVar6 = 2, (*(byte *)((long)piVar3 + lVar9) & 0x40) == 0)) {
                parasail_result_get_traceback_extra_cold_23();
                return (parasail_traceback_t *)0x0;
              }
            }
            else {
              if (iVar6 != 4) {
                parasail_result_get_traceback_extra_cold_25();
                return (parasail_traceback_t *)0x0;
              }
              bVar4 = *(byte *)((long)piVar3 + lVar9);
              if ((bVar4 & 4) != 0) {
                if (seqA == (char *)0x0) {
                  *pcVar13 = '*';
                  *pcVar23 = seqB[uVar24];
                  bVar4 = 0x2a;
                }
                else {
                  *pcVar13 = seqA[iVar7];
                  *pcVar23 = seqB[uVar24];
                  bVar4 = seqA[iVar7];
                }
                bVar1 = seqB[uVar24 & 0xffffffff];
                if (case_sensitive == 0) {
                  pp_Var11 = __ctype_toupper_loc();
                  bVar25 = (*pp_Var11)[(char)bVar4] == (*pp_Var11)[(char)bVar1];
                }
                else {
                  bVar25 = bVar4 == bVar1;
                }
                if (sVar18 != 0) {
                  sVar19 = 0;
                  do {
                    if (abStack_138[sVar19] == bVar4) {
                      bVar25 = (bool)(bVar25 | abStack_138[sVar19 + 1] == bVar1);
                    }
                    else if (abStack_138[sVar19 + 1] == bVar4) {
                      bVar25 = (bool)(bVar25 | abStack_138[sVar19] == bVar1);
                    }
                    sVar19 = sVar19 + 1;
                  } while (sVar18 != sVar19);
                }
                cVar5 = match;
                if (!bVar25) {
                  if (matrix->type == 0) {
                    piVar14 = matrix->mapper;
                    iVar7 = matrix->size * piVar14[bVar4];
                  }
                  else {
                    iVar7 = matrix->size * iVar7;
                    piVar14 = matrix->mapper;
                  }
                  cVar5 = neg;
                  if (0 < matrix->matrix[iVar7 + piVar14[bVar1]]) {
                    cVar5 = pos;
                  }
                }
                *pcVar10 = cVar5;
                lVar22 = lVar22 + -1;
                iVar6 = 4;
                goto LAB_00548773;
              }
              iVar6 = 1;
              bVar25 = true;
              if (((bVar4 & 1) == 0) && (iVar6 = 2, (bVar4 & 2) == 0)) goto LAB_00548ebb;
            }
          }
          lVar9 = lVar22 * lenb + uVar24;
        } while (-1 < lVar22);
        uVar20 = result->flag;
      }
      if (((uVar20 & 4) == 0) && (bVar25)) {
        do {
          *pcVar13 = '-';
          pcVar13 = pcVar13 + 1;
          *pcVar23 = seqB[uVar24];
          pcVar23 = pcVar23 + 1;
          *pcVar10 = ' ';
          pcVar10 = pcVar10 + 1;
          bVar25 = uVar24 != 0;
          uVar24 = uVar24 - 1;
        } while (bVar25);
      }
    }
LAB_00548ebb:
    *pcVar13 = '\0';
    *pcVar23 = '\0';
    *pcVar10 = '\0';
  }
  else {
    if ((uVar20 >> 0x14 & 1) == 0) {
      if ((uVar20 >> 0x15 & 1) == 0) {
        if ((uVar20 >> 0x16 & 1) == 0) {
          if ((uVar20 >> 0x17 & 1) == 0) {
            return (parasail_traceback_t *)0x0;
          }
          sVar18 = (size_t)(lena + lenb + 1);
          local_1a0 = (char *)malloc(sVar18);
          local_198 = (char *)malloc(sVar18);
          local_1a8 = (char *)malloc(sVar18);
          iVar6 = result->end_query;
          lVar22 = (long)iVar6;
          iVar7 = result->end_ref;
          uVar24 = (ulong)iVar7;
          uVar16 = 2;
          if ((uVar20 >> 0x19 & 1) == 0) {
            uVar16 = uVar20 >> 0x18 & 1;
          }
          uVar8 = 4;
          if ((uVar20 >> 0x1a & 1) == 0) {
            uVar8 = (ulong)uVar16;
          }
          auVar26._0_4_ = -(uint)((uVar20 & 0x40000000) == 0);
          auVar26._4_4_ = -(uint)((uVar20 & 0x20000000) == 0);
          auVar26._8_4_ = -(uint)((uVar20 & 0x10000000) == 0);
          auVar26._12_4_ = -(uint)((uVar20 & 0x8000000) == 0);
          uVar16 = movmskps(extraout_EDX,auVar26);
          uVar21 = 8;
          if ((uVar16 & 8) != 0) {
            uVar21 = uVar8;
          }
          uVar8 = 0x10;
          if ((uVar16 & 4) != 0) {
            uVar8 = uVar21;
          }
          uVar21 = 0x20;
          if ((uVar16 & 2) != 0) {
            uVar21 = uVar8;
          }
          uVar8 = 0x40;
          if ((uVar16 & 1) != 0) {
            uVar8 = uVar21;
          }
          piVar3 = ((result->field_4).rowcols)->score_row;
          lVar9 = (long)((long)lena + uVar8 + -1) / (long)uVar8;
          if (alphabet_aliases == (char *)0x0) {
            sVar18 = 0;
          }
          else {
            sVar18 = strlen(alphabet_aliases);
            if ((sVar18 & 0xffffffffffffff01) != 0) {
              parasail_result_get_traceback_extra_cold_16();
              return (parasail_traceback_t *)0x0;
            }
            if (sVar18 == 0) {
              sVar18 = 0;
            }
            else {
              sVar19 = 0;
              do {
                if (case_sensitive == 0) {
                  pp_Var11 = __ctype_toupper_loc();
                  bVar4 = *(byte *)(*pp_Var11 + alphabet_aliases[sVar19]);
                }
                else {
                  bVar4 = alphabet_aliases[sVar19];
                }
                abStack_138[sVar19] = bVar4;
                sVar19 = sVar19 + 1;
              } while (sVar18 != sVar19);
            }
          }
          pcVar13 = local_1a8;
          pcVar10 = local_198;
          pcVar23 = local_1a0;
          if ((uVar20 & 2) != 0) {
            if (iVar6 + 1 == lena) {
              if (iVar7 < lenb + -1) {
                sVar19 = (ulong)((lenb - iVar7) - 2) + 1;
                memset(local_1a0,0x2d,sVar19);
                memset(local_1a8,0x20,sVar19);
                lVar15 = (long)(lenb + -1);
                lVar17 = lVar15 - uVar24;
                do {
                  *pcVar10 = seqB[lVar15];
                  pcVar10 = pcVar10 + 1;
                  lVar15 = lVar15 + -1;
                } while ((long)uVar24 < lVar15);
                pcVar13 = local_1a8 + lVar17;
                pcVar23 = local_1a0 + lVar17;
              }
            }
            else {
              if (iVar7 + 1 != lenb) {
                parasail_result_get_traceback_extra_cold_17();
                return (parasail_traceback_t *)0x0;
              }
              if (iVar6 < lena + -1) {
                lVar17 = (long)(lena + -1);
                do {
                  if (seqA == (char *)0x0) {
                    cVar5 = '*';
                  }
                  else {
                    cVar5 = seqA[lVar17];
                  }
                  *pcVar23 = cVar5;
                  pcVar23 = pcVar23 + 1;
                  *pcVar10 = '-';
                  pcVar10 = pcVar10 + 1;
                  *pcVar13 = ' ';
                  pcVar13 = pcVar13 + 1;
                  lVar17 = lVar17 + -1;
                } while (lVar22 < lVar17);
              }
            }
          }
          bVar25 = -1 < iVar7;
          if (-1 < iVar6 || bVar25) {
            if (-1 < iVar6) {
              lVar17 = (lVar22 % lVar9 + lVar9 * uVar24) * uVar8 + lVar22 / lVar9;
              iVar6 = 4;
              do {
                if ((long)uVar24 < 0) {
                  if ((result->flag & 4) == 0) {
                    lVar9 = lVar22 + 1;
                    lVar22 = lVar22 << 0x20;
                    do {
                      if (seqA == (char *)0x0) {
                        cVar5 = '*';
                      }
                      else {
                        cVar5 = seqA[lVar22 >> 0x20];
                      }
                      *pcVar23 = cVar5;
                      pcVar23 = pcVar23 + 1;
                      *pcVar10 = '-';
                      pcVar10 = pcVar10 + 1;
                      *pcVar13 = ' ';
                      pcVar13 = pcVar13 + 1;
                      lVar9 = lVar9 + -1;
                      lVar22 = lVar22 + -0x100000000;
                    } while (0 < lVar9);
                  }
                  goto LAB_00549d1b;
                }
                if (iVar6 == 1) {
                  *pcVar23 = '-';
                  *pcVar10 = seqB[uVar24];
                  *pcVar13 = ' ';
                  iVar6 = 4;
                  if (((*(ulong *)(piVar3 + lVar17 * 2) & 8) == 0) &&
                     (iVar6 = 1, (*(ulong *)(piVar3 + lVar17 * 2) & 0x10) == 0)) {
                    parasail_result_get_traceback_extra_cold_19();
                    return (parasail_traceback_t *)0x0;
                  }
LAB_00549b1b:
                  pcVar23 = pcVar23 + 1;
                  bVar25 = uVar24 != 0;
                  uVar24 = uVar24 - 1;
                  pcVar13 = pcVar13 + 1;
                  pcVar10 = pcVar10 + 1;
                  if ((lVar22 < 0) && (!bVar25)) goto LAB_00549d1b;
                }
                else {
                  iVar7 = (int)lVar22;
                  if (iVar6 == 2) {
                    if (seqA == (char *)0x0) {
                      cVar5 = '*';
                    }
                    else {
                      cVar5 = seqA[iVar7];
                    }
                    *pcVar23 = cVar5;
                    pcVar23 = pcVar23 + 1;
                    *pcVar10 = '-';
                    pcVar10 = pcVar10 + 1;
                    *pcVar13 = ' ';
                    pcVar13 = pcVar13 + 1;
                    lVar22 = lVar22 + -1;
                    iVar6 = 4;
                    bVar25 = true;
                    if (((*(ulong *)(piVar3 + lVar17 * 2) & 0x20) == 0) &&
                       (iVar6 = 2, (*(ulong *)(piVar3 + lVar17 * 2) & 0x40) == 0)) {
                      parasail_result_get_traceback_extra_cold_18();
                      return (parasail_traceback_t *)0x0;
                    }
                  }
                  else {
                    if (iVar6 != 4) {
                      parasail_result_get_traceback_extra_cold_20();
                      return (parasail_traceback_t *)0x0;
                    }
                    uVar21 = *(ulong *)(piVar3 + lVar17 * 2);
                    if ((uVar21 & 4) != 0) {
                      if (seqA == (char *)0x0) {
                        *pcVar23 = '*';
                        *pcVar10 = seqB[uVar24];
                        bVar4 = 0x2a;
                      }
                      else {
                        *pcVar23 = seqA[iVar7];
                        *pcVar10 = seqB[uVar24];
                        bVar4 = seqA[iVar7];
                      }
                      bVar1 = seqB[uVar24 & 0xffffffff];
                      if (case_sensitive == 0) {
                        pp_Var11 = __ctype_toupper_loc();
                        bVar25 = (*pp_Var11)[(char)bVar4] == (*pp_Var11)[(char)bVar1];
                      }
                      else {
                        bVar25 = bVar4 == bVar1;
                      }
                      if (sVar18 != 0) {
                        sVar19 = 0;
                        do {
                          if (abStack_138[sVar19] == bVar4) {
                            bVar25 = (bool)(bVar25 | abStack_138[sVar19 + 1] == bVar1);
                          }
                          else if (abStack_138[sVar19 + 1] == bVar4) {
                            bVar25 = (bool)(bVar25 | abStack_138[sVar19] == bVar1);
                          }
                          sVar19 = sVar19 + 1;
                        } while (sVar18 != sVar19);
                      }
                      cVar5 = match;
                      if (!bVar25) {
                        if (matrix->type == 0) {
                          piVar14 = matrix->mapper;
                          iVar7 = matrix->size * piVar14[bVar4];
                        }
                        else {
                          iVar7 = matrix->size * iVar7;
                          piVar14 = matrix->mapper;
                        }
                        cVar5 = neg;
                        if (0 < matrix->matrix[iVar7 + piVar14[bVar1]]) {
                          cVar5 = pos;
                        }
                      }
                      *pcVar13 = cVar5;
                      lVar22 = lVar22 + -1;
                      iVar6 = 4;
                      goto LAB_00549b1b;
                    }
                    iVar6 = 1;
                    bVar25 = true;
                    if (((uVar21 & 1) == 0) && (iVar6 = 2, (uVar21 & 2) == 0)) goto LAB_00549d1b;
                  }
                }
                lVar17 = (lVar22 % lVar9 + uVar24 * lVar9) * uVar8 + lVar22 / lVar9;
              } while (-1 < lVar22);
              uVar20 = result->flag;
            }
            if (((uVar20 & 4) == 0) && (bVar25)) {
              do {
                *pcVar23 = '-';
                pcVar23 = pcVar23 + 1;
                *pcVar10 = seqB[uVar24];
                pcVar10 = pcVar10 + 1;
                *pcVar13 = ' ';
                pcVar13 = pcVar13 + 1;
                bVar25 = uVar24 != 0;
                uVar24 = uVar24 - 1;
              } while (bVar25);
            }
          }
        }
        else {
          sVar18 = (size_t)(lena + lenb + 1);
          local_1a0 = (char *)malloc(sVar18);
          local_198 = (char *)malloc(sVar18);
          local_1a8 = (char *)malloc(sVar18);
          iVar6 = result->end_query;
          lVar22 = (long)iVar6;
          iVar7 = result->end_ref;
          uVar24 = (ulong)iVar7;
          uVar16 = 2;
          if ((uVar20 >> 0x19 & 1) == 0) {
            uVar16 = uVar20 >> 0x18 & 1;
          }
          uVar8 = 4;
          if ((uVar20 >> 0x1a & 1) == 0) {
            uVar8 = (ulong)uVar16;
          }
          auVar29._0_4_ = -(uint)((uVar20 & 0x40000000) == 0);
          auVar29._4_4_ = -(uint)((uVar20 & 0x20000000) == 0);
          auVar29._8_4_ = -(uint)((uVar20 & 0x10000000) == 0);
          auVar29._12_4_ = -(uint)((uVar20 & 0x8000000) == 0);
          uVar16 = movmskps(extraout_EDX_02,auVar29);
          uVar21 = 8;
          if ((uVar16 & 8) != 0) {
            uVar21 = uVar8;
          }
          uVar8 = 0x10;
          if ((uVar16 & 4) != 0) {
            uVar8 = uVar21;
          }
          uVar21 = 0x20;
          if ((uVar16 & 2) != 0) {
            uVar21 = uVar8;
          }
          uVar8 = 0x40;
          if ((uVar16 & 1) != 0) {
            uVar8 = uVar21;
          }
          piVar3 = ((result->field_4).rowcols)->score_row;
          lVar9 = (long)((long)lena + uVar8 + -1) / (long)uVar8;
          if (alphabet_aliases == (char *)0x0) {
            sVar18 = 0;
          }
          else {
            sVar18 = strlen(alphabet_aliases);
            if ((sVar18 & 0xffffffffffffff01) != 0) {
              parasail_result_get_traceback_extra_cold_11();
              return (parasail_traceback_t *)0x0;
            }
            if (sVar18 == 0) {
              sVar18 = 0;
            }
            else {
              sVar19 = 0;
              do {
                if (case_sensitive == 0) {
                  pp_Var11 = __ctype_toupper_loc();
                  bVar4 = *(byte *)(*pp_Var11 + alphabet_aliases[sVar19]);
                }
                else {
                  bVar4 = alphabet_aliases[sVar19];
                }
                abStack_138[sVar19] = bVar4;
                sVar19 = sVar19 + 1;
              } while (sVar18 != sVar19);
            }
          }
          pcVar13 = local_1a8;
          pcVar10 = local_198;
          pcVar23 = local_1a0;
          if ((uVar20 & 2) != 0) {
            if (iVar6 + 1 == lena) {
              if (iVar7 < lenb + -1) {
                sVar19 = (ulong)((lenb - iVar7) - 2) + 1;
                memset(local_1a0,0x2d,sVar19);
                memset(local_1a8,0x20,sVar19);
                lVar15 = (long)(lenb + -1);
                lVar17 = lVar15 - uVar24;
                do {
                  *pcVar10 = seqB[lVar15];
                  pcVar10 = pcVar10 + 1;
                  lVar15 = lVar15 + -1;
                } while ((long)uVar24 < lVar15);
                pcVar13 = local_1a8 + lVar17;
                pcVar23 = local_1a0 + lVar17;
              }
            }
            else {
              if (iVar7 + 1 != lenb) {
                parasail_result_get_traceback_extra_cold_12();
                return (parasail_traceback_t *)0x0;
              }
              if (iVar6 < lena + -1) {
                lVar17 = (long)(lena + -1);
                do {
                  if (seqA == (char *)0x0) {
                    cVar5 = '*';
                  }
                  else {
                    cVar5 = seqA[lVar17];
                  }
                  *pcVar23 = cVar5;
                  pcVar23 = pcVar23 + 1;
                  *pcVar10 = '-';
                  pcVar10 = pcVar10 + 1;
                  *pcVar13 = ' ';
                  pcVar13 = pcVar13 + 1;
                  lVar17 = lVar17 + -1;
                } while (lVar22 < lVar17);
              }
            }
          }
          bVar25 = -1 < iVar7;
          if (-1 < iVar6 || bVar25) {
            if (-1 < iVar6) {
              lVar17 = (lVar22 % lVar9 + lVar9 * uVar24) * uVar8 + lVar22 / lVar9;
              iVar6 = 4;
              do {
                if ((long)uVar24 < 0) {
                  if ((result->flag & 4) == 0) {
                    lVar9 = lVar22 + 1;
                    lVar22 = lVar22 << 0x20;
                    do {
                      if (seqA == (char *)0x0) {
                        cVar5 = '*';
                      }
                      else {
                        cVar5 = seqA[lVar22 >> 0x20];
                      }
                      *pcVar23 = cVar5;
                      pcVar23 = pcVar23 + 1;
                      *pcVar10 = '-';
                      pcVar10 = pcVar10 + 1;
                      *pcVar13 = ' ';
                      pcVar13 = pcVar13 + 1;
                      lVar9 = lVar9 + -1;
                      lVar22 = lVar22 + -0x100000000;
                    } while (0 < lVar9);
                  }
                  goto LAB_00549d1b;
                }
                if (iVar6 == 1) {
                  *pcVar23 = '-';
                  *pcVar10 = seqB[uVar24];
                  *pcVar13 = ' ';
                  iVar6 = 4;
                  if (((piVar3[lVar17] & 8U) == 0) && (iVar6 = 1, (piVar3[lVar17] & 0x10U) == 0)) {
                    parasail_result_get_traceback_extra_cold_14();
                    return (parasail_traceback_t *)0x0;
                  }
LAB_00549695:
                  pcVar23 = pcVar23 + 1;
                  bVar25 = uVar24 != 0;
                  uVar24 = uVar24 - 1;
                  pcVar13 = pcVar13 + 1;
                  pcVar10 = pcVar10 + 1;
                  if ((lVar22 < 0) && (!bVar25)) goto LAB_00549d1b;
                }
                else {
                  iVar7 = (int)lVar22;
                  if (iVar6 == 2) {
                    if (seqA == (char *)0x0) {
                      cVar5 = '*';
                    }
                    else {
                      cVar5 = seqA[iVar7];
                    }
                    *pcVar23 = cVar5;
                    pcVar23 = pcVar23 + 1;
                    *pcVar10 = '-';
                    pcVar10 = pcVar10 + 1;
                    *pcVar13 = ' ';
                    pcVar13 = pcVar13 + 1;
                    lVar22 = lVar22 + -1;
                    iVar6 = 4;
                    bVar25 = true;
                    if (((piVar3[lVar17] & 0x20U) == 0) &&
                       (iVar6 = 2, (piVar3[lVar17] & 0x40U) == 0)) {
                      parasail_result_get_traceback_extra_cold_13();
                      return (parasail_traceback_t *)0x0;
                    }
                  }
                  else {
                    if (iVar6 != 4) {
                      parasail_result_get_traceback_extra_cold_15();
                      return (parasail_traceback_t *)0x0;
                    }
                    uVar20 = piVar3[lVar17];
                    if ((uVar20 & 4) != 0) {
                      if (seqA == (char *)0x0) {
                        *pcVar23 = '*';
                        *pcVar10 = seqB[uVar24];
                        bVar4 = 0x2a;
                      }
                      else {
                        *pcVar23 = seqA[iVar7];
                        *pcVar10 = seqB[uVar24];
                        bVar4 = seqA[iVar7];
                      }
                      bVar1 = seqB[uVar24 & 0xffffffff];
                      if (case_sensitive == 0) {
                        pp_Var11 = __ctype_toupper_loc();
                        bVar25 = (*pp_Var11)[(char)bVar4] == (*pp_Var11)[(char)bVar1];
                      }
                      else {
                        bVar25 = bVar4 == bVar1;
                      }
                      if (sVar18 != 0) {
                        sVar19 = 0;
                        do {
                          if (abStack_138[sVar19] == bVar4) {
                            bVar25 = (bool)(bVar25 | abStack_138[sVar19 + 1] == bVar1);
                          }
                          else if (abStack_138[sVar19 + 1] == bVar4) {
                            bVar25 = (bool)(bVar25 | abStack_138[sVar19] == bVar1);
                          }
                          sVar19 = sVar19 + 1;
                        } while (sVar18 != sVar19);
                      }
                      cVar5 = match;
                      if (!bVar25) {
                        if (matrix->type == 0) {
                          piVar14 = matrix->mapper;
                          iVar7 = matrix->size * piVar14[bVar4];
                        }
                        else {
                          iVar7 = matrix->size * iVar7;
                          piVar14 = matrix->mapper;
                        }
                        cVar5 = neg;
                        if (0 < matrix->matrix[iVar7 + piVar14[bVar1]]) {
                          cVar5 = pos;
                        }
                      }
                      *pcVar13 = cVar5;
                      lVar22 = lVar22 + -1;
                      iVar6 = 4;
                      goto LAB_00549695;
                    }
                    iVar6 = 1;
                    bVar25 = true;
                    if (((uVar20 & 1) == 0) && (iVar6 = 2, (uVar20 & 2) == 0)) goto LAB_00549d1b;
                  }
                }
                lVar17 = (lVar22 % lVar9 + uVar24 * lVar9) * uVar8 + lVar22 / lVar9;
              } while (-1 < lVar22);
              uVar20 = result->flag;
            }
            if (((uVar20 & 4) == 0) && (bVar25)) {
              do {
                *pcVar23 = '-';
                pcVar23 = pcVar23 + 1;
                *pcVar10 = seqB[uVar24];
                pcVar10 = pcVar10 + 1;
                *pcVar13 = ' ';
                pcVar13 = pcVar13 + 1;
                bVar25 = uVar24 != 0;
                uVar24 = uVar24 - 1;
              } while (bVar25);
            }
          }
        }
LAB_00549d1b:
        *pcVar23 = '\0';
        *pcVar10 = '\0';
        *pcVar13 = '\0';
        ppVar12 = (parasail_traceback_t *)malloc(0x18);
        sVar18 = strlen(local_1a0);
        pcVar13 = parasail_reverse(local_1a0,sVar18);
        ppVar12->query = pcVar13;
        sVar18 = strlen(local_1a8);
        pcVar13 = parasail_reverse(local_1a8,sVar18);
        ppVar12->comp = pcVar13;
        pcVar13 = local_1a0;
        goto LAB_005493de;
      }
      sVar18 = (size_t)(lena + lenb + 1);
      local_198 = (char *)malloc(sVar18);
      local_1a0 = (char *)malloc(sVar18);
      local_1a8 = (char *)malloc(sVar18);
      iVar6 = result->end_query;
      lVar22 = (long)iVar6;
      iVar7 = result->end_ref;
      uVar24 = (ulong)iVar7;
      uVar16 = 2;
      if ((uVar20 >> 0x19 & 1) == 0) {
        uVar16 = uVar20 >> 0x18 & 1;
      }
      uVar8 = 4;
      if ((uVar20 >> 0x1a & 1) == 0) {
        uVar8 = (ulong)uVar16;
      }
      auVar28._0_4_ = -(uint)((uVar20 & 0x40000000) == 0);
      auVar28._4_4_ = -(uint)((uVar20 & 0x20000000) == 0);
      auVar28._8_4_ = -(uint)((uVar20 & 0x10000000) == 0);
      auVar28._12_4_ = -(uint)((uVar20 & 0x8000000) == 0);
      uVar16 = movmskps(extraout_EDX_01,auVar28);
      uVar21 = 8;
      if ((uVar16 & 8) != 0) {
        uVar21 = uVar8;
      }
      uVar8 = 0x10;
      if ((uVar16 & 4) != 0) {
        uVar8 = uVar21;
      }
      uVar21 = 0x20;
      if ((uVar16 & 2) != 0) {
        uVar21 = uVar8;
      }
      uVar8 = 0x40;
      if ((uVar16 & 1) != 0) {
        uVar8 = uVar21;
      }
      piVar3 = ((result->field_4).rowcols)->score_row;
      lVar9 = (long)((long)lena + uVar8 + -1) / (long)uVar8;
      if (alphabet_aliases == (char *)0x0) {
        sVar18 = 0;
      }
      else {
        sVar18 = strlen(alphabet_aliases);
        if ((sVar18 & 0xffffffffffffff01) != 0) {
          parasail_result_get_traceback_extra_cold_6();
          return (parasail_traceback_t *)0x0;
        }
        if (sVar18 == 0) {
          sVar18 = 0;
        }
        else {
          sVar19 = 0;
          do {
            if (case_sensitive == 0) {
              pp_Var11 = __ctype_toupper_loc();
              bVar4 = *(byte *)(*pp_Var11 + alphabet_aliases[sVar19]);
            }
            else {
              bVar4 = alphabet_aliases[sVar19];
            }
            abStack_138[sVar19] = bVar4;
            sVar19 = sVar19 + 1;
          } while (sVar18 != sVar19);
        }
      }
      pcVar13 = local_1a8;
      pcVar10 = local_1a0;
      pcVar23 = local_198;
      if ((uVar20 & 2) != 0) {
        if (iVar6 + 1 == lena) {
          if (iVar7 < lenb + -1) {
            sVar19 = (ulong)((lenb - iVar7) - 2) + 1;
            memset(local_198,0x2d,sVar19);
            memset(local_1a8,0x20,sVar19);
            lVar15 = (long)(lenb + -1);
            lVar17 = lVar15 - uVar24;
            do {
              *pcVar10 = seqB[lVar15];
              pcVar10 = pcVar10 + 1;
              lVar15 = lVar15 + -1;
            } while ((long)uVar24 < lVar15);
            pcVar13 = local_1a8 + lVar17;
            pcVar23 = local_198 + lVar17;
          }
        }
        else {
          if (iVar7 + 1 != lenb) {
            parasail_result_get_traceback_extra_cold_7();
            return (parasail_traceback_t *)0x0;
          }
          if (iVar6 < lena + -1) {
            lVar17 = (long)(lena + -1);
            do {
              if (seqA == (char *)0x0) {
                cVar5 = '*';
              }
              else {
                cVar5 = seqA[lVar17];
              }
              *pcVar23 = cVar5;
              pcVar23 = pcVar23 + 1;
              *pcVar10 = '-';
              pcVar10 = pcVar10 + 1;
              *pcVar13 = ' ';
              pcVar13 = pcVar13 + 1;
              lVar17 = lVar17 + -1;
            } while (lVar22 < lVar17);
          }
        }
      }
      bVar25 = -1 < iVar7;
      if (-1 < iVar6 || bVar25) {
        if (-1 < iVar6) {
          lVar17 = (lVar22 % lVar9 + lVar9 * uVar24) * uVar8 + lVar22 / lVar9;
          iVar6 = 4;
          do {
            if ((long)uVar24 < 0) {
              if ((result->flag & 4) == 0) {
                lVar9 = lVar22 + 1;
                lVar22 = lVar22 << 0x20;
                do {
                  if (seqA == (char *)0x0) {
                    cVar5 = '*';
                  }
                  else {
                    cVar5 = seqA[lVar22 >> 0x20];
                  }
                  *pcVar23 = cVar5;
                  pcVar23 = pcVar23 + 1;
                  *pcVar10 = '-';
                  pcVar10 = pcVar10 + 1;
                  *pcVar13 = ' ';
                  pcVar13 = pcVar13 + 1;
                  lVar9 = lVar9 + -1;
                  lVar22 = lVar22 + -0x100000000;
                } while (0 < lVar9);
              }
              goto LAB_00549389;
            }
            if (iVar6 == 1) {
              *pcVar23 = '-';
              *pcVar10 = seqB[uVar24];
              *pcVar13 = ' ';
              uVar2 = *(ushort *)((long)piVar3 + lVar17 * 2);
              iVar6 = 4;
              if (((uVar2 & 8) == 0) && (iVar6 = 1, (uVar2 & 0x10) == 0)) {
                parasail_result_get_traceback_extra_cold_9();
                return (parasail_traceback_t *)0x0;
              }
LAB_0054919e:
              pcVar23 = pcVar23 + 1;
              bVar25 = uVar24 != 0;
              uVar24 = uVar24 - 1;
              pcVar13 = pcVar13 + 1;
              pcVar10 = pcVar10 + 1;
              if ((lVar22 < 0) && (!bVar25)) goto LAB_00549389;
            }
            else {
              iVar7 = (int)lVar22;
              if (iVar6 == 2) {
                if (seqA == (char *)0x0) {
                  cVar5 = '*';
                }
                else {
                  cVar5 = seqA[iVar7];
                }
                *pcVar23 = cVar5;
                pcVar23 = pcVar23 + 1;
                *pcVar10 = '-';
                pcVar10 = pcVar10 + 1;
                *pcVar13 = ' ';
                pcVar13 = pcVar13 + 1;
                lVar22 = lVar22 + -1;
                uVar2 = *(ushort *)((long)piVar3 + lVar17 * 2);
                iVar6 = 4;
                bVar25 = true;
                if (((uVar2 & 0x20) == 0) && (iVar6 = 2, (uVar2 & 0x40) == 0)) {
                  parasail_result_get_traceback_extra_cold_8();
                  return (parasail_traceback_t *)0x0;
                }
              }
              else {
                if (iVar6 != 4) {
                  parasail_result_get_traceback_extra_cold_10();
                  return (parasail_traceback_t *)0x0;
                }
                uVar2 = *(ushort *)((long)piVar3 + lVar17 * 2);
                if ((uVar2 & 4) != 0) {
                  if (seqA == (char *)0x0) {
                    *pcVar23 = '*';
                    *pcVar10 = seqB[uVar24];
                    bVar4 = 0x2a;
                  }
                  else {
                    *pcVar23 = seqA[iVar7];
                    *pcVar10 = seqB[uVar24];
                    bVar4 = seqA[iVar7];
                  }
                  bVar1 = seqB[uVar24 & 0xffffffff];
                  if (case_sensitive == 0) {
                    pp_Var11 = __ctype_toupper_loc();
                    bVar25 = (*pp_Var11)[(char)bVar4] == (*pp_Var11)[(char)bVar1];
                  }
                  else {
                    bVar25 = bVar4 == bVar1;
                  }
                  if (sVar18 != 0) {
                    sVar19 = 0;
                    do {
                      if (abStack_138[sVar19] == bVar4) {
                        bVar25 = (bool)(bVar25 | abStack_138[sVar19 + 1] == bVar1);
                      }
                      else if (abStack_138[sVar19 + 1] == bVar4) {
                        bVar25 = (bool)(bVar25 | abStack_138[sVar19] == bVar1);
                      }
                      sVar19 = sVar19 + 1;
                    } while (sVar18 != sVar19);
                  }
                  cVar5 = match;
                  if (!bVar25) {
                    if (matrix->type == 0) {
                      piVar14 = matrix->mapper;
                      iVar7 = matrix->size * piVar14[bVar4];
                    }
                    else {
                      iVar7 = matrix->size * iVar7;
                      piVar14 = matrix->mapper;
                    }
                    cVar5 = neg;
                    if (0 < matrix->matrix[iVar7 + piVar14[bVar1]]) {
                      cVar5 = pos;
                    }
                  }
                  *pcVar13 = cVar5;
                  lVar22 = lVar22 + -1;
                  iVar6 = 4;
                  goto LAB_0054919e;
                }
                iVar6 = 1;
                bVar25 = true;
                if (((uVar2 & 1) == 0) && (iVar6 = 2, (uVar2 & 2) == 0)) goto LAB_00549389;
              }
            }
            lVar17 = (lVar22 % lVar9 + uVar24 * lVar9) * uVar8 + lVar22 / lVar9;
          } while (-1 < lVar22);
          uVar20 = result->flag;
        }
        if (((uVar20 & 4) == 0) && (bVar25)) {
          do {
            *pcVar23 = '-';
            pcVar23 = pcVar23 + 1;
            *pcVar10 = seqB[uVar24];
            pcVar10 = pcVar10 + 1;
            *pcVar13 = ' ';
            pcVar13 = pcVar13 + 1;
            bVar25 = uVar24 != 0;
            uVar24 = uVar24 - 1;
          } while (bVar25);
        }
      }
    }
    else {
      sVar18 = (size_t)(lena + lenb + 1);
      local_198 = (char *)malloc(sVar18);
      local_1a0 = (char *)malloc(sVar18);
      local_1a8 = (char *)malloc(sVar18);
      iVar6 = result->end_query;
      lVar22 = (long)iVar6;
      iVar7 = result->end_ref;
      uVar24 = (ulong)iVar7;
      uVar16 = 2;
      if ((uVar20 >> 0x19 & 1) == 0) {
        uVar16 = uVar20 >> 0x18 & 1;
      }
      uVar8 = 4;
      if ((uVar20 >> 0x1a & 1) == 0) {
        uVar8 = (ulong)uVar16;
      }
      auVar27._0_4_ = -(uint)((uVar20 & 0x40000000) == 0);
      auVar27._4_4_ = -(uint)((uVar20 & 0x20000000) == 0);
      auVar27._8_4_ = -(uint)((uVar20 & 0x10000000) == 0);
      auVar27._12_4_ = -(uint)((uVar20 & 0x8000000) == 0);
      uVar16 = movmskps(extraout_EDX_00,auVar27);
      uVar21 = 8;
      if ((uVar16 & 8) != 0) {
        uVar21 = uVar8;
      }
      uVar8 = 0x10;
      if ((uVar16 & 4) != 0) {
        uVar8 = uVar21;
      }
      uVar21 = 0x20;
      if ((uVar16 & 2) != 0) {
        uVar21 = uVar8;
      }
      uVar8 = 0x40;
      if ((uVar16 & 1) != 0) {
        uVar8 = uVar21;
      }
      piVar3 = ((result->field_4).rowcols)->score_row;
      lVar9 = (long)((long)lena + uVar8 + -1) / (long)uVar8;
      if (alphabet_aliases == (char *)0x0) {
        sVar18 = 0;
      }
      else {
        sVar18 = strlen(alphabet_aliases);
        if ((sVar18 & 0xffffffffffffff01) != 0) {
          parasail_result_get_traceback_extra_cold_1();
          return (parasail_traceback_t *)0x0;
        }
        if (sVar18 == 0) {
          sVar18 = 0;
        }
        else {
          sVar19 = 0;
          do {
            if (case_sensitive == 0) {
              pp_Var11 = __ctype_toupper_loc();
              bVar4 = *(byte *)(*pp_Var11 + alphabet_aliases[sVar19]);
            }
            else {
              bVar4 = alphabet_aliases[sVar19];
            }
            abStack_138[sVar19] = bVar4;
            sVar19 = sVar19 + 1;
          } while (sVar18 != sVar19);
        }
      }
      pcVar13 = local_1a8;
      pcVar10 = local_1a0;
      pcVar23 = local_198;
      if ((uVar20 & 2) != 0) {
        if (iVar6 + 1 == lena) {
          if (iVar7 < lenb + -1) {
            sVar19 = (ulong)((lenb - iVar7) - 2) + 1;
            memset(local_198,0x2d,sVar19);
            memset(local_1a8,0x20,sVar19);
            lVar15 = (long)(lenb + -1);
            lVar17 = lVar15 - uVar24;
            do {
              *pcVar10 = seqB[lVar15];
              pcVar10 = pcVar10 + 1;
              lVar15 = lVar15 + -1;
            } while ((long)uVar24 < lVar15);
            pcVar13 = local_1a8 + lVar17;
            pcVar23 = local_198 + lVar17;
          }
        }
        else {
          if (iVar7 + 1 != lenb) {
            parasail_result_get_traceback_extra_cold_2();
            return (parasail_traceback_t *)0x0;
          }
          if (iVar6 < lena + -1) {
            lVar17 = (long)(lena + -1);
            do {
              if (seqA == (char *)0x0) {
                cVar5 = '*';
              }
              else {
                cVar5 = seqA[lVar17];
              }
              *pcVar23 = cVar5;
              pcVar23 = pcVar23 + 1;
              *pcVar10 = '-';
              pcVar10 = pcVar10 + 1;
              *pcVar13 = ' ';
              pcVar13 = pcVar13 + 1;
              lVar17 = lVar17 + -1;
            } while (lVar22 < lVar17);
          }
        }
      }
      bVar25 = -1 < iVar7;
      if (-1 < iVar6 || bVar25) {
        if (-1 < iVar6) {
          lVar17 = (lVar22 % lVar9 + lVar9 * uVar24) * uVar8 + lVar22 / lVar9;
          iVar6 = 4;
          do {
            if ((long)uVar24 < 0) {
              if ((result->flag & 4) == 0) {
                lVar9 = lVar22 + 1;
                lVar22 = lVar22 << 0x20;
                do {
                  if (seqA == (char *)0x0) {
                    cVar5 = '*';
                  }
                  else {
                    cVar5 = seqA[lVar22 >> 0x20];
                  }
                  *pcVar23 = cVar5;
                  pcVar23 = pcVar23 + 1;
                  *pcVar10 = '-';
                  pcVar10 = pcVar10 + 1;
                  *pcVar13 = ' ';
                  pcVar13 = pcVar13 + 1;
                  lVar9 = lVar9 + -1;
                  lVar22 = lVar22 + -0x100000000;
                } while (0 < lVar9);
              }
              goto LAB_00549389;
            }
            if (iVar6 == 1) {
              *pcVar23 = '-';
              *pcVar10 = seqB[uVar24];
              *pcVar13 = ' ';
              iVar6 = 4;
              if (((*(byte *)((long)piVar3 + lVar17) & 8) == 0) &&
                 (iVar6 = 1, (*(byte *)((long)piVar3 + lVar17) & 0x10) == 0)) {
                parasail_result_get_traceback_extra_cold_4();
                return (parasail_traceback_t *)0x0;
              }
LAB_00548c7a:
              pcVar23 = pcVar23 + 1;
              bVar25 = uVar24 != 0;
              uVar24 = uVar24 - 1;
              pcVar13 = pcVar13 + 1;
              pcVar10 = pcVar10 + 1;
              if ((lVar22 < 0) && (!bVar25)) goto LAB_00549389;
            }
            else {
              iVar7 = (int)lVar22;
              if (iVar6 == 2) {
                if (seqA == (char *)0x0) {
                  cVar5 = '*';
                }
                else {
                  cVar5 = seqA[iVar7];
                }
                *pcVar23 = cVar5;
                pcVar23 = pcVar23 + 1;
                *pcVar10 = '-';
                pcVar10 = pcVar10 + 1;
                *pcVar13 = ' ';
                pcVar13 = pcVar13 + 1;
                lVar22 = lVar22 + -1;
                iVar6 = 4;
                bVar25 = true;
                if (((*(byte *)((long)piVar3 + lVar17) & 0x20) == 0) &&
                   (iVar6 = 2, (*(byte *)((long)piVar3 + lVar17) & 0x40) == 0)) {
                  parasail_result_get_traceback_extra_cold_3();
                  return (parasail_traceback_t *)0x0;
                }
              }
              else {
                if (iVar6 != 4) {
                  parasail_result_get_traceback_extra_cold_5();
                  return (parasail_traceback_t *)0x0;
                }
                bVar4 = *(byte *)((long)piVar3 + lVar17);
                if ((bVar4 & 4) != 0) {
                  if (seqA == (char *)0x0) {
                    *pcVar23 = '*';
                    *pcVar10 = seqB[uVar24];
                    bVar4 = 0x2a;
                  }
                  else {
                    *pcVar23 = seqA[iVar7];
                    *pcVar10 = seqB[uVar24];
                    bVar4 = seqA[iVar7];
                  }
                  bVar1 = seqB[uVar24 & 0xffffffff];
                  if (case_sensitive == 0) {
                    pp_Var11 = __ctype_toupper_loc();
                    bVar25 = (*pp_Var11)[(char)bVar4] == (*pp_Var11)[(char)bVar1];
                  }
                  else {
                    bVar25 = bVar4 == bVar1;
                  }
                  if (sVar18 != 0) {
                    sVar19 = 0;
                    do {
                      if (abStack_138[sVar19] == bVar4) {
                        bVar25 = (bool)(bVar25 | abStack_138[sVar19 + 1] == bVar1);
                      }
                      else if (abStack_138[sVar19 + 1] == bVar4) {
                        bVar25 = (bool)(bVar25 | abStack_138[sVar19] == bVar1);
                      }
                      sVar19 = sVar19 + 1;
                    } while (sVar18 != sVar19);
                  }
                  cVar5 = match;
                  if (!bVar25) {
                    if (matrix->type == 0) {
                      piVar14 = matrix->mapper;
                      iVar7 = matrix->size * piVar14[bVar4];
                    }
                    else {
                      iVar7 = matrix->size * iVar7;
                      piVar14 = matrix->mapper;
                    }
                    cVar5 = neg;
                    if (0 < matrix->matrix[iVar7 + piVar14[bVar1]]) {
                      cVar5 = pos;
                    }
                  }
                  *pcVar13 = cVar5;
                  lVar22 = lVar22 + -1;
                  iVar6 = 4;
                  goto LAB_00548c7a;
                }
                iVar6 = 1;
                bVar25 = true;
                if (((bVar4 & 1) == 0) && (iVar6 = 2, (bVar4 & 2) == 0)) goto LAB_00549389;
              }
            }
            lVar17 = (lVar22 % lVar9 + uVar24 * lVar9) * uVar8 + lVar22 / lVar9;
          } while (-1 < lVar22);
          uVar20 = result->flag;
        }
        if (((uVar20 & 4) == 0) && (bVar25)) {
          do {
            *pcVar23 = '-';
            pcVar23 = pcVar23 + 1;
            *pcVar10 = seqB[uVar24];
            pcVar10 = pcVar10 + 1;
            *pcVar13 = ' ';
            pcVar13 = pcVar13 + 1;
            bVar25 = uVar24 != 0;
            uVar24 = uVar24 - 1;
          } while (bVar25);
        }
      }
    }
LAB_00549389:
    *pcVar23 = '\0';
    *pcVar10 = '\0';
    *pcVar13 = '\0';
  }
  ppVar12 = (parasail_traceback_t *)malloc(0x18);
  sVar18 = strlen(local_198);
  pcVar13 = parasail_reverse(local_198,sVar18);
  ppVar12->query = pcVar13;
  sVar18 = strlen(local_1a8);
  pcVar13 = parasail_reverse(local_1a8,sVar18);
  ppVar12->comp = pcVar13;
  pcVar13 = local_198;
  local_198 = local_1a0;
LAB_005493de:
  sVar18 = strlen(local_198);
  pcVar10 = parasail_reverse(local_198,sVar18);
  ppVar12->ref = pcVar10;
  free(pcVar13);
  free(local_198);
  free(local_1a8);
  return ppVar12;
}

Assistant:

parasail_traceback_t* parasail_result_get_traceback_extra(
        parasail_result_t *result,
        const char *seqA,
        int lena,
        const char *seqB,
        int lenb,
        const parasail_matrix_t *matrix,
        char match, char pos, char neg,
        int case_sensitive,
        const char *alphabet_aliases)
{
    PARASAIL_ASSERT(parasail_result_is_trace(result));

    if (result->flag & PARASAIL_FLAG_STRIPED
            || result->flag & PARASAIL_FLAG_SCAN) {
        if (result->flag & PARASAIL_FLAG_BITS_8) {
            return parasail_result_get_traceback_striped_8(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_16) {
            return parasail_result_get_traceback_striped_16(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_32) {
            return parasail_result_get_traceback_striped_32(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
        else if (result->flag & PARASAIL_FLAG_BITS_64) {
            return parasail_result_get_traceback_striped_64(
                    result, seqA, lena, seqB, lenb,
                    matrix, match, pos, neg,
                    case_sensitive, alphabet_aliases);
        }
    }
    else {
        return parasail_result_get_traceback_8(
                result, seqA, lena, seqB, lenb,
                matrix, match, pos, neg,
                case_sensitive, alphabet_aliases);
    }

    return NULL; /* unreachable */
}